

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::getPartials
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,int cumulativeScaleIndex,
          double *outPartials)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  
  iVar6 = -5;
  if ((-1 < bufferIndex) && (iVar6 = -5, bufferIndex < *(int *)&(this->super_BeagleImpl).field_0xc))
  {
    iVar6 = this->kPatternCount;
    iVar11 = this->kPaddedPatternCount;
    iVar9 = iVar11 - iVar6;
    if ((iVar9 == 0) && (this->kStateCount == this->kPartialsPaddedStateCount)) {
      uVar1 = this->kPartialsSize;
      if ((ulong)uVar1 != 0) {
        pdVar8 = this->gPartials[(uint)bufferIndex];
        uVar7 = 0;
        do {
          outPartials[uVar7] = pdVar8[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
    }
    else {
      uVar1 = this->kStateCount;
      uVar3 = this->kPartialsPaddedStateCount;
      iVar2 = this->kCategoryCount;
      if (uVar1 == uVar3) {
        if (0 < iVar2) {
          pdVar8 = this->gPartials[(uint)bufferIndex];
          uVar3 = iVar6 * uVar1;
          iVar6 = 0;
          pdVar10 = outPartials;
          do {
            if ((ulong)uVar3 != 0) {
              uVar7 = 0;
              do {
                pdVar10[uVar7] = pdVar8[uVar7];
                uVar7 = uVar7 + 1;
              } while (uVar3 != uVar7);
            }
            iVar6 = iVar6 + 1;
            pdVar10 = pdVar10 + (int)uVar3;
            pdVar8 = pdVar8 + (int)(iVar11 * uVar1);
          } while (iVar6 != iVar2);
        }
      }
      else if (0 < iVar2) {
        pdVar8 = this->gPartials[(uint)bufferIndex];
        iVar11 = 0;
        pdVar10 = outPartials;
        do {
          if (0 < iVar6) {
            iVar5 = 0;
            do {
              if ((ulong)uVar1 != 0) {
                uVar7 = 0;
                do {
                  pdVar10[uVar7] = pdVar8[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar1 != uVar7);
              }
              pdVar10 = pdVar10 + (int)uVar1;
              pdVar8 = pdVar8 + (int)uVar3;
              iVar5 = iVar5 + 1;
            } while (iVar5 != iVar6);
          }
          pdVar8 = pdVar8 + (int)(iVar9 * uVar3);
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar2);
      }
    }
    iVar6 = 0;
    if ((cumulativeScaleIndex != -1) && (0 < this->kPatternCount)) {
      pdVar8 = this->gScaleBuffers[cumulativeScaleIndex];
      lVar12 = 0;
      iVar6 = 0;
      do {
        dVar13 = exp(pdVar8[lVar12]);
        iVar11 = this->kStateCount;
        if (0 < iVar11) {
          lVar4 = 0;
          do {
            outPartials[iVar6 + lVar4] = dVar13 * outPartials[iVar6 + lVar4];
            lVar4 = lVar4 + 1;
          } while (iVar11 != (int)lVar4);
          iVar6 = iVar6 + (int)lVar4;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < this->kPatternCount);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getPartials(int bufferIndex,
                               int cumulativeScaleIndex,
                               double* outPartials) {

    // TODO: Test with and without padding
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    if ((kPatternCount == kPaddedPatternCount) && (kStateCount == kPartialsPaddedStateCount)) {
        beagleMemCpy(outPartials, gPartials[bufferIndex], kPartialsSize);
    } else if (kStateCount == kPartialsPaddedStateCount) {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kPatternCount * kStateCount);
            offsetOutPartials += kPatternCount * kStateCount;
            offsetBeaglePartials += kPaddedPatternCount * kStateCount;
        }
    } else {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kStateCount);
                offsetOutPartials += kStateCount;
                offsetBeaglePartials += kPartialsPaddedStateCount;
            }
            offsetBeaglePartials += (kPaddedPatternCount - kPatternCount) * kPartialsPaddedStateCount;
        }
    }

    if (cumulativeScaleIndex != BEAGLE_OP_NONE) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
        int index = 0;
        for(int k=0; k<kPatternCount; k++) {
            REALTYPE scaleFactor = exp(cumulativeScaleBuffer[k]);
            for(int i=0; i<kStateCount; i++) {
                outPartials[index] *= scaleFactor;
                index++;
            }
        }
        // TODO: Do we assume the cumulativeScaleBuffer is on the log-scale?
    }

    return BEAGLE_SUCCESS;
}